

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall
test_adjacency_graph_contains_undirected_Test::TestBody
          (test_adjacency_graph_contains_undirected_Test *this)

{
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_558;
  AssertHelper local_538;
  Message local_530;
  int local_528 [2];
  pair<unsigned_long,_unsigned_long> local_520;
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_4d8;
  Message local_4d0;
  int local_4c8 [2];
  pair<unsigned_long,_unsigned_long> local_4c0;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_478;
  Message local_470;
  int local_468 [2];
  pair<unsigned_long,_unsigned_long> local_460;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_418;
  Message local_410;
  int local_408 [2];
  pair<unsigned_long,_unsigned_long> local_400;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3b8;
  Message local_3b0;
  int local_3a8 [2];
  pair<unsigned_long,_unsigned_long> local_3a0;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_358;
  Message local_350;
  int local_348 [2];
  pair<unsigned_long,_unsigned_long> local_340;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2f8;
  Message local_2f0;
  int local_2e8 [2];
  pair<unsigned_long,_unsigned_long> local_2e0;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_298;
  Message local_290;
  int local_288 [2];
  pair<unsigned_long,_unsigned_long> local_280;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_238;
  Message local_230;
  int local_228 [2];
  pair<unsigned_long,_unsigned_long> local_220;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c8 [2];
  pair<unsigned_long,_unsigned_long> local_1c0;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_178;
  Message local_170;
  int local_168 [2];
  pair<unsigned_long,_unsigned_long> local_160;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_118;
  Message local_110 [3];
  int local_f8 [2];
  pair<unsigned_long,_unsigned_long> local_f0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  int local_c0 [8];
  pair<unsigned_long,_unsigned_long> local_a0;
  pair<unsigned_long,_unsigned_long> local_90;
  pair<unsigned_long,_unsigned_long> local_80;
  pair<unsigned_long,_unsigned_long> local_70;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> *local_50;
  undefined8 local_48;
  Adjacency_Graph<false> local_40 [8];
  Adjacency_Graph<true> graph;
  test_adjacency_graph_contains_undirected_Test *this_local;
  
  local_c0[7] = 0;
  local_c0[6] = 1;
  graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_a0,local_c0 + 7,local_c0 + 6)
  ;
  local_c0[5] = 1;
  local_c0[4] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_90,local_c0 + 5,local_c0 + 4)
  ;
  local_c0[3] = 2;
  local_c0[2] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_80,local_c0 + 3,local_c0 + 2)
  ;
  local_c0[1] = 0;
  local_c0[0] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_70,local_c0 + 1,local_c0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_60,
             (int *)((long)&gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),(int *)&gtest_ar_.message_);
  local_48 = 5;
  edge_graph._M_len = 5;
  edge_graph._M_array = &local_a0;
  local_50 = &local_a0;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_40,edge_graph);
  local_f8[1] = 0;
  local_f8[0] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_f0,local_f8 + 1,local_f8);
  local_d9 = Disa::Adjacency_Graph<false>::contains(local_40,&local_f0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_d8,
               (AssertionResult *)"graph.contains({0, 1})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x215,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_168[1] = 1;
  local_168[0] = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_160,local_168 + 1,local_168);
  local_149 = Disa::Adjacency_Graph<false>::contains(local_40,&local_160);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_148,
               (AssertionResult *)"graph.contains({1, 0})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x216,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_1c8[1] = 1;
  local_1c8[0] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_1c0,local_1c8 + 1,local_1c8);
  local_1a9 = Disa::Adjacency_Graph<false>::contains(local_40,&local_1c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1a8,
               (AssertionResult *)"graph.contains({1, 2})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x217,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_228[1] = 2;
  local_228[0] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_220,local_228 + 1,local_228);
  local_209 = Disa::Adjacency_Graph<false>::contains(local_40,&local_220);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_208,
               (AssertionResult *)"graph.contains({2, 1})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x218,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_288[1] = 2;
  local_288[0] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_280,local_288 + 1,local_288);
  local_269 = Disa::Adjacency_Graph<false>::contains(local_40,&local_280);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_268,
               (AssertionResult *)"graph.contains({2, 3})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x219,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_2e8[1] = 3;
  local_2e8[0] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_2e0,local_2e8 + 1,local_2e8);
  local_2c9 = Disa::Adjacency_Graph<false>::contains(local_40,&local_2e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_2c8,
               (AssertionResult *)"graph.contains({3, 2})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x21a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_348[1] = 0;
  local_348[0] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_340,local_348 + 1,local_348);
  local_329 = Disa::Adjacency_Graph<false>::contains(local_40,&local_340);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_328,
               (AssertionResult *)"graph.contains({0, 3})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x21b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_3a8[1] = 3;
  local_3a8[0] = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_3a0,local_3a8 + 1,local_3a8);
  local_389 = Disa::Adjacency_Graph<false>::contains(local_40,&local_3a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_388,&local_389,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_388,
               (AssertionResult *)"graph.contains({3, 0})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x21c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_408[1] = 1;
  local_408[0] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_400,local_408 + 1,local_408);
  local_3e9 = Disa::Adjacency_Graph<false>::contains(local_40,&local_400);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_3e8,
               (AssertionResult *)"graph.contains({1, 3})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x21d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  local_468[1] = 3;
  local_468[0] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_460,local_468 + 1,local_468);
  local_449 = Disa::Adjacency_Graph<false>::contains(local_40,&local_460);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_448,
               (AssertionResult *)"graph.contains({3, 1})","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x21e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_4c8[1] = 0;
  local_4c8[0] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_4c0,local_4c8 + 1,local_4c8);
  bVar1 = Disa::Adjacency_Graph<false>::contains(local_40,&local_4c0);
  local_4a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_4a8,
               (AssertionResult *)"graph.contains({0, 2})","true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x21f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  local_528[1] = 2;
  local_528[0] = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_520,local_528 + 1,local_528);
  bVar1 = Disa::Adjacency_Graph<false>::contains(local_40,&local_520);
  local_509 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_508,&local_509,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_558,(internal *)local_508,(AssertionResult *)"graph.contains({2, 0})","true",
               "false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x220,pcVar2);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    std::__cxx11::string::~string((string *)&local_558);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_40);
  return;
}

Assistant:

TEST(test_adjacency_graph, contains_undirected) {
  Adjacency_Graph<false> graph({{0, 1}, {1, 2}, {2, 3}, {0, 3}, {1, 3}});

  EXPECT_TRUE(graph.contains({0, 1}));
  EXPECT_TRUE(graph.contains({1, 0}));
  EXPECT_TRUE(graph.contains({1, 2}));
  EXPECT_TRUE(graph.contains({2, 1}));
  EXPECT_TRUE(graph.contains({2, 3}));
  EXPECT_TRUE(graph.contains({3, 2}));
  EXPECT_TRUE(graph.contains({0, 3}));
  EXPECT_TRUE(graph.contains({3, 0}));
  EXPECT_TRUE(graph.contains({1, 3}));
  EXPECT_TRUE(graph.contains({3, 1}));
  EXPECT_FALSE(graph.contains({0, 2}));
  EXPECT_FALSE(graph.contains({2, 0}));
}